

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

vector<Interval,_std::allocator<Interval>_> *
expandLatest(vector<Interval,_std::allocator<Interval>_> *__return_storage_ptr__,Interval *latest,
            Rules *rules)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  Datetime *pDVar4;
  undefined8 *puVar5;
  Interval *__b;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  Interval *pIVar6;
  byte bVar7;
  vector<Range,_std::allocator<Range>_> exclusions;
  vector<Interval,_std::allocator<Interval>_> flattened;
  Interval interval;
  vector<Range,_std::allocator<Range>_> local_138;
  undefined1 local_120 [48];
  undefined1 local_f0 [112];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  bVar7 = 0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Range::is_open(&latest->super_Range);
  if (bVar1) {
    Datetime::Datetime((Datetime *)local_120);
    Range::Range((Range *)local_f0,&(latest->super_Range).start,(Datetime *)local_120);
    getAllExclusions(&local_138,rules,(Range *)local_f0);
    if (local_138.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_138.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      flatten((vector<Interval,_std::allocator<Interval>_> *)local_120,latest,&local_138);
      if (1 < (ulong)(((long)(local_120._8_8_ - local_120._0_8_) >> 6) * -0x5555555555555555)) {
        __b = (Interval *)(local_120._8_8_ + -0xc0);
        pIVar6 = (Interval *)local_120._0_8_;
        if ((ulong)local_120._0_8_ < __b && local_120._0_8_ != local_120._8_8_) {
          do {
            std::swap<Interval>(pIVar6,__b);
            pIVar6 = pIVar6 + 1;
            __b = __b + -1;
          } while (pIVar6 < __b);
        }
        if (local_120._0_8_ != local_120._8_8_) {
          iVar3 = 1;
          __x = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_120._0_8_ + 0x90);
          do {
            pDVar4 = &(((Interval *)(__x + -3))->super_Range).start;
            puVar5 = (undefined8 *)(local_f0 + 8);
            for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
              *puVar5 = *(undefined8 *)pDVar4;
              pDVar4 = (Datetime *)((long)pDVar4 + (ulong)bVar7 * -0x10 + 8);
              puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
            }
            local_f0._0_8_ = &PTR__Interval_001a16e8;
            local_f0[0x6c] = *(undefined1 *)((long)(__x + -1) + 0xc);
            local_f0._104_4_ = *(undefined4 *)((long)(__x + -1) + 8);
            local_80._M_p = (pointer)&local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,*(long *)((long)(__x + -1) + 0x10),
                       *(long *)((long)(__x + -1) + 0x18) + *(long *)((long)(__x + -1) + 0x10));
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_Rb_tree(&local_60,&__x->_M_t);
            local_f0[0x6c] = true;
            local_f0._104_4_ = iVar3;
            std::vector<Interval,_std::allocator<Interval>_>::emplace_back<Interval>
                      (__return_storage_ptr__,(Interval *)local_f0);
            local_f0._0_8_ = &PTR__Interval_001a16e8;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_p != &local_70) {
              operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
            }
            iVar3 = iVar3 + 1;
            pIVar6 = (Interval *)(__x + 1);
            __x = __x + 4;
          } while (pIVar6 != (Interval *)local_120._8_8_);
        }
      }
      std::vector<Interval,_std::allocator<Interval>_>::~vector
                ((vector<Interval,_std::allocator<Interval>_> *)local_120);
    }
    std::vector<Range,_std::allocator<Range>_>::~vector(&local_138);
  }
  if ((__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<Interval,_std::allocator<Interval>_>::push_back(__return_storage_ptr__,latest);
    (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1].id = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Interval> expandLatest (const Interval& latest, const Rules& rules)
{
  int current_id = 0;
  std::vector <Interval> intervals;
  // If the latest interval is open, check for synthetic intervals
  if (latest.is_open ())
  {
    auto exclusions = getAllExclusions (rules, {latest.start, Datetime ()});
    if (! exclusions.empty ())
    {
      std::vector <Interval> flattened = flatten (latest, exclusions);

      // If flatten() converted the latest interval into a group of synthetic
      // intervals, the number of returned intervals will be greater than 1.
      // Otherwise, it just returned the non-synthetic, latest interval.
      if (flattened.size () > 1)
      {
        std::reverse (flattened.begin (), flattened.end ());
        for (auto interval : flattened)
        {
          interval.synthetic = true;
          interval.id = ++current_id;
          intervals.push_back (std::move (interval));
        }
      }
    }
  }

  if (intervals.empty ())
  {
    intervals.push_back (latest);
    intervals.back ().id = 1;
  }
  return intervals;
}